

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O0

bool __thiscall auto_array<float>::pop(auto_array<float> *this,float *elements,size_t length)

{
  float *in_RDX;
  long in_RSI;
  float *in_RDI;
  bool local_1;
  
  if (*(float **)(in_RDI + 4) < in_RDX) {
    local_1 = false;
  }
  else {
    if (in_RSI != 0) {
      PodCopy<float>(in_RDX,in_RDI,0x10e3fc);
    }
    PodMove<float>(in_RDX,in_RDI,0x10e420);
    *(long *)(in_RDI + 4) = *(long *)(in_RDI + 4) - (long)in_RDX;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool pop(T * elements, size_t length)
  {
    if (length > length_) {
      return false;
    }
    if (elements) {
      PodCopy(elements, data_, length);
    }
    PodMove(data_, data_ + length, length_ - length);

    length_ -= length;

    return true;
  }